

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O1

Gia_Man_t * Gia_ManFromMiniAig(Mini_Aig_t *p,Vec_Int_t **pvCopies)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar4;
  Vec_Int_t *p_01;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  int iVar9;
  int nObjsMax;
  
  iVar9 = p->nSize;
  nObjsMax = iVar9 / 2;
  p_00 = Gia_ManStart(nObjsMax);
  pcVar4 = (char *)malloc(8);
  builtin_strncpy(pcVar4,"MiniAig",8);
  p_00->pName = pcVar4;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < nObjsMax - 1U) {
    iVar8 = nObjsMax;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar8;
  if (iVar8 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar8 << 2);
  }
  p_01->pArray = piVar5;
  Vec_IntPush(p_01,0);
  Gia_ManHashAlloc(p_00);
  if (3 < iVar9) {
    iVar9 = 2;
    if (2 < nObjsMax) {
      iVar9 = nObjsMax;
    }
    iVar8 = 1;
    do {
      iVar3 = Mini_AigNodeIsPi(p,iVar8);
      if (iVar3 == 0) {
        pGVar7 = (Gia_Man_t *)p;
        iVar3 = Mini_AigNodeIsPo(p,iVar8);
        if (iVar3 == 0) {
          pGVar7 = (Gia_Man_t *)p;
          iVar3 = Mini_AigNodeIsAnd(p,iVar8);
          if (iVar3 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                          ,0x53,"Gia_Man_t *Gia_ManFromMiniAig(Mini_Aig_t *, Vec_Int_t **)");
          }
          iVar3 = Gia_ObjFromMiniFanin0Copy(pGVar7,p_01,p,iVar8);
          iLit1 = Gia_ObjFromMiniFanin1Copy(pGVar7,p_01,p,iVar8);
          iVar3 = Gia_ManHashAnd(p_00,iVar3,iLit1);
        }
        else {
          iVar3 = Gia_ObjFromMiniFanin0Copy(pGVar7,p_01,p,iVar8);
          iVar3 = Gia_ManAppendCo(p_00,iVar3);
        }
      }
      else {
        pGVar6 = Gia_ManAppendObj(p_00);
        uVar1 = *(ulong *)pGVar6;
        *(ulong *)pGVar6 = uVar1 | 0x9fffffff;
        *(ulong *)pGVar6 =
             uVar1 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar2 = p_00->pObjs;
        if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) {
LAB_00775f7d:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * -0x55555555);
        pGVar2 = p_00->pObjs;
        if ((pGVar6 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar6)) goto LAB_00775f7d;
        iVar3 = (int)((ulong)((long)pGVar6 - (long)pGVar2) >> 2) * 0x55555556;
      }
      Vec_IntPush(p_01,iVar3);
      iVar8 = iVar8 + 1;
    } while (iVar9 != iVar8);
  }
  Gia_ManHashStop(p_00);
  if (p_01->nSize != nObjsMax) {
    __assert_fail("Vec_IntSize(vCopies) == nNodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMini.c"
                  ,0x57,"Gia_Man_t *Gia_ManFromMiniAig(Mini_Aig_t *, Vec_Int_t **)");
  }
  if (pvCopies == (Vec_Int_t **)0x0) {
    if (p_01->pArray != (int *)0x0) {
      free(p_01->pArray);
      p_01->pArray = (int *)0x0;
    }
    free(p_01);
  }
  else {
    *pvCopies = p_01;
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar7 = Gia_ManCleanup(p_00);
  if (pvCopies != (Vec_Int_t **)0x0) {
    Gia_ManDupRemapLiterals(*pvCopies,p_00);
  }
  Gia_ManStop(p_00);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManFromMiniAig( Mini_Aig_t * p, Vec_Int_t ** pvCopies )
{
    Gia_Man_t * pGia, * pTemp;
    Vec_Int_t * vCopies;
    int i, iGiaLit = 0, nNodes;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pGia = Gia_ManStart( nNodes );
    pGia->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, 0 );
    // iterate through the objects
    Gia_ManHashAlloc( pGia );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            iGiaLit = Gia_ManAppendCi(pGia);
        else if ( Mini_AigNodeIsPo( p, i ) )
            iGiaLit = Gia_ManAppendCo(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i));
        else if ( Mini_AigNodeIsAnd( p, i ) )
            iGiaLit = Gia_ManHashAnd(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i), Gia_ObjFromMiniFanin1Copy(pGia, vCopies, p, i));
        else assert( 0 );
        Vec_IntPush( vCopies, iGiaLit );
    }
    Gia_ManHashStop( pGia );
    assert( Vec_IntSize(vCopies) == nNodes );
    if ( pvCopies )
        *pvCopies = vCopies;
    else
        Vec_IntFree( vCopies );
    Gia_ManSetRegNum( pGia, Mini_AigRegNum(p) );
    pGia = Gia_ManCleanup( pTemp = pGia );
    if ( pvCopies )
        Gia_ManDupRemapLiterals( *pvCopies, pTemp );
    Gia_ManStop( pTemp );
    return pGia;
}